

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object.cpp
# Opt level: O3

uint __thiscall ON_Brep::ClearComponentStates(ON_Brep *this,ON_ComponentStatus states_to_clear)

{
  uchar uVar1;
  uchar uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  ON_BrepVertex *pOVar10;
  ON_BrepEdge *pOVar11;
  ON_BrepTrim *pOVar12;
  ON_BrepLoop *pOVar13;
  ON_BrepFace *pOVar14;
  uint uVar15;
  ON_BrepVertex *pOVar16;
  ON_BrepEdge *pOVar17;
  ON_BrepTrim *pOVar18;
  ON_BrepLoop *pOVar19;
  ON_ComponentStatus *pOVar20;
  ON_BrepFace *pOVar21;
  ON_ComponentStatus local_22;
  
  bVar7 = ON_ComponentStatus::IsClear(&local_22);
  uVar4 = ON_AggregateComponentStatus::NotCurrent._24_8_;
  uVar3 = ON_AggregateComponentStatus::NotCurrent._8_8_;
  uVar5 = ON_AggregateComponentStatus::NotCurrent._0_8_;
  uVar15 = 0;
  if (!bVar7) {
    uVar15 = ON_AggregateComponentStatus::NotCurrent.m_hidden_count;
    (this->m_aggregate_status).m_highlighted_count =
         ON_AggregateComponentStatus::NotCurrent.m_highlighted_count;
    uVar6 = ON_AggregateComponentStatus::NotCurrent._24_8_;
    (this->m_aggregate_status).m_hidden_count = uVar15;
    ON_AggregateComponentStatus::NotCurrent.m_locked_count = (uint)uVar4;
    ON_AggregateComponentStatus::NotCurrent.m_damaged_count = SUB84(uVar4,4);
    uVar15 = ON_AggregateComponentStatus::NotCurrent.m_damaged_count;
    (this->m_aggregate_status).m_locked_count =
         ON_AggregateComponentStatus::NotCurrent.m_locked_count;
    ON_AggregateComponentStatus::NotCurrent._24_8_ = uVar6;
    uVar4 = ON_AggregateComponentStatus::NotCurrent._0_8_;
    (this->m_aggregate_status).m_damaged_count = uVar15;
    ON_AggregateComponentStatus::NotCurrent.m_aggregate_status = SUB82(uVar5,0);
    ON_AggregateComponentStatus::NotCurrent.m_current = SUB81(uVar5,2);
    uVar1 = ON_AggregateComponentStatus::NotCurrent.m_current;
    ON_AggregateComponentStatus::NotCurrent.m_reserved1 = SUB81(uVar5,3);
    uVar2 = ON_AggregateComponentStatus::NotCurrent.m_reserved1;
    ON_AggregateComponentStatus::NotCurrent.m_component_count = SUB84(uVar5,4);
    uVar15 = ON_AggregateComponentStatus::NotCurrent.m_component_count;
    (this->m_aggregate_status).m_aggregate_status =
         ON_AggregateComponentStatus::NotCurrent.m_aggregate_status;
    ON_AggregateComponentStatus::NotCurrent._0_8_ = uVar4;
    uVar5 = ON_AggregateComponentStatus::NotCurrent._8_8_;
    (this->m_aggregate_status).m_current = uVar1;
    (this->m_aggregate_status).m_reserved1 = uVar2;
    (this->m_aggregate_status).m_component_count = uVar15;
    ON_AggregateComponentStatus::NotCurrent.m_selected_count = (uint)uVar3;
    ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count = SUB84(uVar3,4);
    uVar15 = ON_AggregateComponentStatus::NotCurrent.m_selected_persistent_count;
    (this->m_aggregate_status).m_selected_count =
         ON_AggregateComponentStatus::NotCurrent.m_selected_count;
    ON_AggregateComponentStatus::NotCurrent._8_8_ = uVar5;
    (this->m_aggregate_status).m_selected_persistent_count = uVar15;
    pOVar16 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a
    ;
    uVar9 = (ulong)(uint)(this->m_V).super_ON_ObjectArray<ON_BrepVertex>.
                         super_ON_ClassArray<ON_BrepVertex>.m_count;
    pOVar10 = pOVar16;
    if (uVar9 == 0) {
      pOVar10 = (ON_BrepVertex *)0x0;
    }
    local_22 = states_to_clear;
    if (pOVar10 == (ON_BrepVertex *)0x0) {
      uVar15 = 0;
    }
    else {
      uVar15 = 0;
      pOVar20 = &pOVar16->m_status;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(pOVar20,local_22);
        uVar15 = uVar15 + uVar8;
        pOVar16 = (ON_BrepVertex *)(pOVar20 + -0x18);
        pOVar20 = pOVar20 + 0x2c;
      } while (pOVar16 < pOVar10 + (uVar9 - 1));
    }
    pOVar17 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar9 = (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                         super_ON_ClassArray<ON_BrepEdge>.m_count;
    pOVar11 = pOVar17;
    if (uVar9 == 0) {
      pOVar11 = (ON_BrepEdge *)0x0;
    }
    if (pOVar11 != (ON_BrepEdge *)0x0) {
      pOVar20 = &pOVar17->m_status;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(pOVar20,local_22);
        uVar15 = uVar15 + uVar8;
        pOVar17 = (ON_BrepEdge *)(pOVar20 + -0x24);
        pOVar20 = pOVar20 + 0x44;
      } while (pOVar17 < pOVar11 + (uVar9 - 1));
    }
    pOVar18 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    uVar9 = (ulong)(uint)(this->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_count;
    pOVar12 = pOVar18;
    if (uVar9 == 0) {
      pOVar12 = (ON_BrepTrim *)0x0;
    }
    if (pOVar12 != (ON_BrepTrim *)0x0) {
      pOVar20 = &pOVar18->m_status;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(pOVar20,local_22);
        uVar15 = uVar15 + uVar8;
        pOVar18 = (ON_BrepTrim *)(pOVar20 + -0x24);
        pOVar20 = pOVar20 + 0x74;
      } while (pOVar18 < pOVar12 + (uVar9 - 1));
    }
    pOVar19 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    uVar9 = (ulong)(uint)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                         super_ON_ClassArray<ON_BrepLoop>.m_count;
    pOVar13 = pOVar19;
    if (uVar9 == 0) {
      pOVar13 = (ON_BrepLoop *)0x0;
    }
    if (pOVar13 != (ON_BrepLoop *)0x0) {
      pOVar20 = &pOVar19->m_status;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(pOVar20,local_22);
        uVar15 = uVar15 + uVar8;
        pOVar19 = (ON_BrepLoop *)(pOVar20 + -0xc);
        pOVar20 = pOVar20 + 0x3c;
      } while (pOVar19 < pOVar13 + (uVar9 - 1));
    }
    pOVar21 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
    uVar9 = (ulong)(uint)(this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                         super_ON_ClassArray<ON_BrepFace>.m_count;
    pOVar14 = pOVar21;
    if (uVar9 == 0) {
      pOVar14 = (ON_BrepFace *)0x0;
    }
    if (pOVar14 != (ON_BrepFace *)0x0) {
      pOVar20 = &pOVar21->m_status;
      do {
        uVar8 = ON_ComponentStatus::ClearStates(pOVar20,local_22);
        uVar15 = uVar15 + uVar8;
        pOVar21 = (ON_BrepFace *)(pOVar20 + -0x14);
        pOVar20 = pOVar20 + 0x6c;
      } while (pOVar21 < pOVar14 + (uVar9 - 1));
    }
  }
  return uVar15;
}

Assistant:

unsigned int ON_Brep::ClearComponentStates(
  ON_ComponentStatus states_to_clear
  ) const
{
  if (states_to_clear.IsClear())
    return 0U;

  m_aggregate_status = ON_AggregateComponentStatus::NotCurrent;

  unsigned int rc = 0;

  ON_ArrayIterator< const ON_BrepVertex > vit( m_V.Array(), m_V.UnsignedCount() );
  for ( const ON_BrepVertex* p = vit.First(); nullptr != p; p = vit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepEdge > eit( m_E.Array(), m_E.UnsignedCount() );
  for ( const ON_BrepEdge* p = eit.First(); nullptr != p; p = eit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepTrim > tit( m_T.Array(), m_T.UnsignedCount() );
  for ( const ON_BrepTrim* p = tit.First(); nullptr != p; p = tit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepLoop > lit( m_L.Array(), m_L.UnsignedCount() );
  for ( const ON_BrepLoop* p = lit.First(); nullptr != p; p = lit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  ON_ArrayIterator< const ON_BrepFace > fit( m_F.Array(), m_F.UnsignedCount() );
  for ( const ON_BrepFace* p = fit.First(); nullptr != p; p = fit.Next())
  {
    rc += p->m_status.ClearStates(states_to_clear);
  }

  return rc;
}